

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.h
# Opt level: O3

void __thiscall ValueInfo::SetSymStore(ValueInfo *this,Sym *sym)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (sym != (Sym *)0x0) {
    if (sym->m_kind != SymKindStack) {
      if (sym->m_kind == SymKindProperty) goto LAB_00470a5b;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar2) goto LAB_00470a6a;
      *puVar3 = 0;
    }
    if (((ulong)sym[1]._vptr_Sym & 0x10000) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/ValueInfo.h"
                         ,0xff,
                         "(sym == nullptr || sym->IsPropertySym() || !sym->AsStackSym()->IsTypeSpec())"
                         ,
                         "sym == nullptr || sym->IsPropertySym() || !sym->AsStackSym()->IsTypeSpec()"
                        );
      if (!bVar2) {
LAB_00470a6a:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
LAB_00470a5b:
  this->symStore = sym;
  return;
}

Assistant:

void                    SetSymStore(Sym * sym)
    {
        // Sym store should always be a var sym
        Assert(sym == nullptr || sym->IsPropertySym() || !sym->AsStackSym()->IsTypeSpec()); // property syms always have a var stack sym
        this->symStore = sym;
    }